

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmxreftobin.cpp
# Opt level: O1

void fmxreftobin::doit(void)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  fmXref q;
  char line [4096];
  undefined1 local_1044 [4];
  undefined1 local_1040 [4];
  undefined1 local_103c [4];
  char local_1038 [4104];
  
  fgets(local_1038,0x1000,_stdin);
  pcVar2 = fgets(local_1038,0x1000,_stdin);
  if (pcVar2 != (char *)0x0) {
    uVar3 = 1;
    do {
      iVar1 = __isoc99_sscanf(local_1038,"%d,%d,%d",local_1044,local_1040,local_103c);
      if (iVar1 != 3) {
        fprintf(_stderr,"FATAL: Invalid data in line %d:\n%s",(ulong)uVar3,local_1038);
        return;
      }
      fwrite(local_1044,0xc,1,_stdout);
      uVar3 = uVar3 + 1;
      pcVar2 = fgets(local_1038,0x1000,_stdin);
    } while (pcVar2 != (char *)0x0);
  }
  return;
}

Assistant:

void doit() {

        fmXref q;
        char line[4096];
        int lineno = 0;
        fgets(line, sizeof(line), stdin);
        lineno++;
        while (fgets(line, sizeof(line), stdin) != 0) {
            if (sscanf(line, "%d,%d,%d", &q.output_id, &q.agg_id,
                       &q.layer_id) != 3) {
                fprintf(stderr, "FATAL: Invalid data in line %d:\n%s", lineno, line);
                return;
            } else {
                fwrite(&q, sizeof(q), 1, stdout);
            }
            lineno++;
        }
    }